

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O2

uint32_t getHostID(ILcidPosixMap *this_0,char *posixID,UErrorCode *status)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ILcidPosixElement *pIVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar2 = strlen(posixID);
  uVar6 = 0;
  uVar4 = 0;
  for (uVar3 = 0; uVar3 != this_0->numRegions; uVar3 = uVar3 + 1) {
    pcVar1 = this_0->regionMaps[uVar3].posixID;
    for (uVar7 = 0; (posixID[uVar7] != '\0' && (posixID[uVar7] == pcVar1[uVar7])); uVar7 = uVar7 + 1
        ) {
    }
    if (((int)uVar6 < (int)uVar7) && (pcVar1[uVar7] == '\0')) {
      if ((int)sVar2 == (int)uVar7) {
        pIVar5 = this_0->regionMaps + uVar3;
        goto LAB_002d4d8f;
      }
      uVar6 = uVar7 & 0xffffffff;
      uVar4 = uVar3 & 0xffffffff;
    }
  }
  if ((posixID[uVar6] == '@') || (posixID[uVar6] == '_')) {
    pIVar5 = this_0->regionMaps;
    if (pIVar5[(int)uVar4].posixID[uVar6] == '\0') {
      *status = U_ERROR_WARNING_START;
      pIVar5 = pIVar5 + (int)uVar4;
      goto LAB_002d4d8f;
    }
  }
  else {
    pIVar5 = this_0->regionMaps;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002d4d8f:
  return pIVar5->hostID;
}

Assistant:

static uint32_t
getHostID(const ILcidPosixMap *this_0, const char* posixID, UErrorCode* status)
{
    int32_t bestIdx = 0;
    int32_t bestIdxDiff = 0;
    int32_t posixIDlen = (int32_t)uprv_strlen(posixID);
    uint32_t idx;

    for (idx = 0; idx < this_0->numRegions; idx++ ) {
        int32_t sameChars = idCmp(posixID, this_0->regionMaps[idx].posixID);
        if (sameChars > bestIdxDiff && this_0->regionMaps[idx].posixID[sameChars] == 0) {
            if (posixIDlen == sameChars) {
                /* Exact match */
                return this_0->regionMaps[idx].hostID;
            }
            bestIdxDiff = sameChars;
            bestIdx = idx;
        }
    }
    /* We asked for something unusual, like en_ZZ, and we try to return the number for the same language. */
    /* We also have to make sure that sid and si and similar string subsets don't match. */
    if ((posixID[bestIdxDiff] == '_' || posixID[bestIdxDiff] == '@')
        && this_0->regionMaps[bestIdx].posixID[bestIdxDiff] == 0)
    {
        *status = U_USING_FALLBACK_WARNING;
        return this_0->regionMaps[bestIdx].hostID;
    }

    /*no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return this_0->regionMaps->hostID;
}